

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.c
# Opt level: O2

LispPTR N_OP_llsh1(LispPTR a)

{
  uint uVar1;
  LispPTR *pLVar2;
  uint *NAddr;
  LispPTR LVar3;
  
  if ((a & 0xfff0000) == 0xf0000) {
    LVar3 = a | 0xffff0000;
  }
  else if ((a & 0xfff0000) == 0xe0000) {
    LVar3 = a & 0xffff;
  }
  else {
    if ((*(ushort *)((ulong)(a >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff) != 2) {
      MachineState.tosvalue = a;
      MachineState.errorexit = 1;
      return 0xffffffff;
    }
    pLVar2 = NativeAligned4FromLAddr(a);
    LVar3 = *pLVar2;
  }
  uVar1 = LVar3 * 2;
  if ((uVar1 & 0xffff0000) == 0xffff0000) {
    LVar3 = uVar1 & 0xfffe | 0xf0000;
  }
  else {
    if ((uVar1 & 0xffff0000) != 0) {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar1;
      LVar3 = LAddrFromNative(NAddr);
      return LVar3;
    }
    LVar3 = uVar1 | 0xe0000;
  }
  return LVar3;
}

Assistant:

LispPTR N_OP_llsh1(LispPTR a) {
  int arg1;

  N_GETNUMBER(a, arg1, du_ufn);
  arg1 <<= 1;
  N_ARITH_SWITCH(arg1);

 du_ufn:
  ERROR_EXIT(a);
}